

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::remove_filename(path *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  path local_30;
  path *local_10;
  path *this_local;
  
  local_10 = this;
  bVar1 = has_filename(this);
  if (bVar1) {
    lVar2 = std::__cxx11::string::size();
    filename(&local_30,this);
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)this,lVar2 - lVar3);
    ~path(&local_30);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::remove_filename()
{
    if (has_filename()) {
        _path.erase(_path.size() - filename()._path.size());
    }
    return *this;
}